

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComments.cpp
# Opt level: O0

void __thiscall
RemoveCommentsTest_testMultiLineComments_Test::~RemoveCommentsTest_testMultiLineComments_Test
          (RemoveCommentsTest_testMultiLineComments_Test *this)

{
  RemoveCommentsTest_testMultiLineComments_Test *this_local;
  
  ~RemoveCommentsTest_testMultiLineComments_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(RemoveCommentsTest, testMultiLineComments)
{
    const char* szTest =
        "/* comment to be removed */\n"
        "valid text /* \n "
        " comment across multiple lines */"
        " / * Incomplete comment */ /* /* multiple comments */ */";

    const char* szTestResult =
        "                           \n"
        "valid text      "
        "                                 "
        " / * Incomplete comment */                            */";

    const size_t len( ::strlen( szTest ) + 1 );
    char* szTest2 = new char[ len ];
    ::strncpy( szTest2, szTest, len );

    CommentRemover::RemoveMultiLineComments("/*","*/",szTest2,' ');
    EXPECT_STREQ(szTestResult, szTest2);

    delete[] szTest2;
}